

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

BOOL get_ucp(PCRE2_SPTR8 *ptrptr,BOOL *negptr,uint *ptypeptr,uint *pdataptr,int *errorcodeptr,
            compile_block_8 *cb)

{
  byte bVar1;
  PCRE2_SPTR8 pPVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  byte *pbVar8;
  PCRE2_SPTR8 pPVar9;
  uint uVar10;
  byte local_68 [32];
  int *local_48;
  uint *local_40;
  uint *local_38;
  
  pPVar2 = *ptrptr;
  *negptr = 0;
  pPVar9 = pPVar2 + 1;
  bVar1 = pPVar2[1];
  if ((ulong)bVar1 == 0x7b) {
    if (pPVar2[2] == '^') {
      pPVar9 = pPVar2 + 2;
      *negptr = 1;
    }
    lVar3 = 0;
    do {
      lVar7 = lVar3;
      bVar1 = pPVar9[lVar7 + 1];
      if (bVar1 == 0) break;
      if (bVar1 == 0x7d) {
        pbVar8 = local_68 + lVar7;
        pPVar9 = pPVar9 + lVar7 + 1;
        goto LAB_001166c0;
      }
      local_68[lVar7] = bVar1;
      lVar3 = lVar7 + 1;
    } while (lVar7 + 1 != 0x1f);
    pPVar9 = pPVar9 + lVar7 + 1;
  }
  else if ((cb->ctypes[bVar1] & 2) != 0) {
    pbVar8 = local_68 + 1;
    local_68[0] = bVar1;
LAB_001166c0:
    *pbVar8 = 0;
    *ptrptr = pPVar9;
    uVar10 = 0xa9;
    iVar6 = 0;
    local_48 = errorcodeptr;
    local_40 = pdataptr;
    local_38 = ptypeptr;
    do {
      uVar5 = iVar6 + uVar10 >> 1;
      iVar4 = _pcre2_strcmp_c8_8(local_68,"Any" + _pcre2_utt_8[uVar5].name_offset);
      if (iVar4 == 0) {
        *local_38 = (uint)_pcre2_utt_8[uVar5].type;
        *local_40 = (uint)_pcre2_utt_8[uVar5].value;
        return 1;
      }
      if (0 < iVar4) {
        iVar6 = uVar5 + 1;
        uVar5 = uVar10;
      }
      uVar10 = uVar5;
    } while (iVar6 < (int)uVar10);
    *local_48 = 0x93;
    return 0;
  }
  *errorcodeptr = 0x92;
  *ptrptr = pPVar9;
  return 0;
}

Assistant:

static BOOL
get_ucp(PCRE2_SPTR *ptrptr, BOOL *negptr, unsigned int *ptypeptr,
  unsigned int *pdataptr, int *errorcodeptr, compile_block *cb)
{
register PCRE2_UCHAR c;
int i, bot, top;
PCRE2_SPTR ptr = *ptrptr;
PCRE2_UCHAR name[32];

*negptr = FALSE;
c = *(++ptr);

/* \P or \p can be followed by a name in {}, optionally preceded by ^ for
negation. */

if (c == CHAR_LEFT_CURLY_BRACKET)
  {
  if (ptr[1] == CHAR_CIRCUMFLEX_ACCENT)
    {
    *negptr = TRUE;
    ptr++;
    }
  for (i = 0; i < (int)(sizeof(name) / sizeof(PCRE2_UCHAR)) - 1; i++)
    {
    c = *(++ptr);
    if (c == CHAR_NULL) goto ERROR_RETURN;
    if (c == CHAR_RIGHT_CURLY_BRACKET) break;
    name[i] = c;
    }
  if (c != CHAR_RIGHT_CURLY_BRACKET) goto ERROR_RETURN;
  name[i] = 0;
  }

/* Otherwise there is just one following character, which must be an ASCII
letter. */

else if (MAX_255(c) && (cb->ctypes[c] & ctype_letter) != 0)
  {
  name[0] = c;
  name[1] = 0;
  }
else goto ERROR_RETURN;

*ptrptr = ptr;

/* Search for a recognized property name using binary chop. */

bot = 0;
top = PRIV(utt_size);

while (bot < top)
  {
  int r;
  i = (bot + top) >> 1;
  r = PRIV(strcmp_c8)(name, PRIV(utt_names) + PRIV(utt)[i].name_offset);
  if (r == 0)
    {
    *ptypeptr = PRIV(utt)[i].type;
    *pdataptr = PRIV(utt)[i].value;
    return TRUE;
    }
  if (r > 0) bot = i + 1; else top = i;
  }
*errorcodeptr = ERR47;   /* Unrecognized name */
return FALSE;

ERROR_RETURN:            /* Malformed \P or \p */
*errorcodeptr = ERR46;
*ptrptr = ptr;
return FALSE;
}